

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicObjectPropertyEnumerator.cpp
# Opt level: O0

DynamicType * __thiscall
Js::DynamicObjectPropertyEnumerator::GetTypeToEnumerate(DynamicObjectPropertyEnumerator *this)

{
  bool bVar1;
  DynamicType **ppDVar2;
  DynamicObject *this_00;
  DynamicType *pDVar3;
  DynamicObjectPropertyEnumerator *this_local;
  
  bVar1 = GetSnapShotSemantics(this);
  if (bVar1) {
    pDVar3 = Memory::WriteBarrierPtr<Js::DynamicType>::operator->(&this->initialType);
    bVar1 = DynamicType::GetIsLocked(pDVar3);
    if ((bVar1) && ((DAT_01eca2a4 & 1) != 0)) {
      ppDVar2 = Memory::PointerValue<Js::DynamicType>(&this->initialType);
      return *ppDVar2;
    }
  }
  this_00 = Memory::WriteBarrierPtr<Js::DynamicObject>::operator->(&this->object);
  pDVar3 = DynamicObject::GetDynamicType(this_00);
  return pDVar3;
}

Assistant:

DynamicType * DynamicObjectPropertyEnumerator::GetTypeToEnumerate() const
    {
        return
            GetSnapShotSemantics() &&
            initialType->GetIsLocked() &&
            CONFIG_FLAG(TypeSnapshotEnumeration)
            ? PointerValue(initialType)
            : object->GetDynamicType();
    }